

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QRect>::erase(QMovableArrayOps<QRect> *this,QRect *b,qsizetype n)

{
  QRect *pQVar1;
  long lVar2;
  QRect *pQVar3;
  QRect *__src;
  
  __src = b + n;
  pQVar1 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr;
  lVar2 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size;
  pQVar3 = pQVar1 + lVar2;
  if (__src == pQVar3 || pQVar1 != b) {
    if (__src != pQVar3) {
      memmove(b,__src,(long)pQVar3 - (long)__src);
      lVar2 = (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.ptr = __src;
  }
  (this->super_QGenericArrayOps<QRect>).super_QArrayDataPointer<QRect>.size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }